

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long PaUtil_ZeroOutput(PaUtilBufferProcessor *bp,unsigned_long frameCount)

{
  long lVar1;
  ulong in_RSI;
  long in_RDI;
  uint i;
  uint framesToZero;
  PaUtilChannelDescriptor *hostOutputChannels;
  ulong local_28;
  uint local_20;
  
  lVar1 = *(long *)(in_RDI + 0xf8);
  local_28 = in_RSI;
  if (*(ulong *)(in_RDI + 0xe8) < in_RSI) {
    local_28 = *(ulong *)(in_RDI + 0xe8);
  }
  for (local_20 = 0; local_20 < *(uint *)(in_RDI + 0x48); local_20 = local_20 + 1) {
    (**(code **)(in_RDI + 0x60))
              (*(undefined8 *)(lVar1 + (ulong)local_20 * 0x10),
               *(undefined4 *)(lVar1 + (ulong)local_20 * 0x10 + 8),(int)local_28);
    *(ulong *)(lVar1 + (ulong)local_20 * 0x10) =
         *(long *)(lVar1 + (ulong)local_20 * 0x10) +
         (ulong)(uint)((int)local_28 * *(int *)(lVar1 + (ulong)local_20 * 0x10 + 8) *
                      *(int *)(in_RDI + 0x4c));
  }
  *(ulong *)(in_RDI + 0xe8) = (local_28 & 0xffffffff) + *(long *)(in_RDI + 0xe8);
  return local_28 & 0xffffffff;
}

Assistant:

unsigned long PaUtil_ZeroOutput( PaUtilBufferProcessor* bp, unsigned long frameCount )
{
    PaUtilChannelDescriptor *hostOutputChannels;
    unsigned int framesToZero;
    unsigned int i;

    hostOutputChannels = bp->hostOutputChannels[0];
    framesToZero = PA_MIN_( bp->hostOutputFrameCount[0], frameCount );

    for( i=0; i<bp->outputChannelCount; ++i )
    {
        bp->outputZeroer(   hostOutputChannels[i].data,
                            hostOutputChannels[i].stride,
                            framesToZero );


        /* advance dest ptr for next iteration */
        hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                framesToZero * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
    }

    bp->hostOutputFrameCount[0] += framesToZero;
    
    return framesToZero;
}